

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O2

void ptls_minicrypto_random_bytes(void *buf,size_t len)

{
  cf_hash_drbg_sha256 *ctx;
  uint32_t uVar1;
  int __fd;
  ssize_t sVar2;
  int *piVar3;
  char *__s;
  undefined1 *__buf;
  size_t __nbytes;
  long *in_FS_OFFSET;
  uint8_t entropy [256];
  undefined1 local_138 [128];
  undefined1 local_b8 [136];
  
  ctx = (cf_hash_drbg_sha256 *)(*in_FS_OFFSET + -0x74);
  uVar1 = cf_hash_drbg_sha256_needs_reseed(ctx);
  if (uVar1 != 0) {
    __fd = open("/dev/urandom",0x80000);
    if ((__fd == -1) && (__fd = open("/dev/random",0x80000), __fd == -1)) {
      __s = "ptls_minicrypto_random_bytes: could not open neither /dev/random or /dev/urandom";
LAB_001203ae:
      perror(__s);
      abort();
    }
    __buf = local_138;
    for (__nbytes = 0x100; __nbytes != 0; __nbytes = __nbytes - sVar2) {
      while (sVar2 = read(__fd,__buf,__nbytes), sVar2 == -1) {
        piVar3 = __errno_location();
        if (*piVar3 != 4) goto LAB_001203a7;
      }
      if (sVar2 < 0) {
LAB_001203a7:
        __s = "ptls_minicrypto_random_bytes";
        goto LAB_001203ae;
      }
      __buf = __buf + sVar2;
    }
    close(__fd);
    cf_hash_drbg_sha256_init(ctx,local_138,0x80,local_b8,0x80,"ptls",4);
  }
  cf_hash_drbg_sha256_gen(ctx,buf,len);
  return;
}

Assistant:

void ptls_minicrypto_random_bytes(void *buf, size_t len)
{
    static PTLS_THREADLOCAL cf_hash_drbg_sha256 ctx;

    if (cf_hash_drbg_sha256_needs_reseed(&ctx)) {
        uint8_t entropy[256];
        read_entropy(entropy, sizeof(entropy));
        cf_hash_drbg_sha256_init(&ctx, entropy, sizeof(entropy) / 2, entropy + sizeof(entropy) / 2, sizeof(entropy) / 2, "ptls", 4);
    }
    cf_hash_drbg_sha256_gen(&ctx, buf, len);
}